

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::shrink_to_fit
          (VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *this)

{
  void *in_RDI;
  VkMappedMemoryRange *newArray;
  VkAllocationCallbacks *pAllocationCallbacks;
  
  if (*(ulong *)((long)in_RDI + 0x10) < *(ulong *)((long)in_RDI + 0x18)) {
    pAllocationCallbacks = (VkAllocationCallbacks *)0x0;
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      pAllocationCallbacks =
           (VkAllocationCallbacks *)
           VmaAllocateArray<VkMappedMemoryRange>((VkAllocationCallbacks *)0x0,(size_t)in_RDI);
      memcpy(pAllocationCallbacks,*(void **)((long)in_RDI + 8),*(long *)((long)in_RDI + 0x10) * 0x28
            );
    }
    VmaFree(pAllocationCallbacks,in_RDI);
    *(undefined8 *)((long)in_RDI + 0x18) = *(undefined8 *)((long)in_RDI + 0x10);
    *(VkAllocationCallbacks **)((long)in_RDI + 8) = pAllocationCallbacks;
  }
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::shrink_to_fit()
{
    if (m_Capacity > m_Count)
    {
        T* newArray = VMA_NULL;
        if (m_Count > 0)
        {
            newArray = VmaAllocateArray<T>(m_Allocator.m_pCallbacks, m_Count);
            memcpy(newArray, m_pArray, m_Count * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = m_Count;
        m_pArray = newArray;
    }
}